

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O0

S2Point * __thiscall
S2::PlateCarreeProjection::Unproject
          (S2Point *__return_storage_ptr__,PlateCarreeProjection *this,R2Point *p)

{
  R2Point local_28;
  R2Point *local_18;
  R2Point *p_local;
  PlateCarreeProjection *this_local;
  
  local_18 = p;
  p_local = (R2Point *)this;
  local_28.c_ = (VType  [2])ToLatLng(this,p);
  S2LatLng::ToPoint(__return_storage_ptr__,(S2LatLng *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point PlateCarreeProjection::Unproject(const R2Point& p) const {
  return ToLatLng(p).ToPoint();
}